

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

void * gdImageGifAnimEndPtr(int *size)

{
  undefined1 *puVar1;
  
  puVar1 = (undefined1 *)gdMalloc(1);
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0x3b;
    *size = 1;
  }
  return puVar1;
}

Assistant:

BGD_DECLARE(void *) gdImageGifAnimEndPtr(int *size)
{
	char *rv = (char *) gdMalloc(1);
	if(!rv) {
		return 0;
	}
	*rv = ';';
	*size = 1;
	return (void *)rv;
}